

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O3

bool TdokuConstrain(bool pencilmark,char *puzzle)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined1 uVar5;
  State *pSVar6;
  char cVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  pointer piVar11;
  char cVar12;
  vector<int,_std::allocator<int>_> permutation;
  State state;
  State test_state;
  vector<int,_std::allocator<int>_> local_638 [2];
  State local_600 [3];
  
  pSVar6 = local_600;
  lVar8 = 0;
  do {
    lVar10 = 0x10;
    *(undefined8 *)((long)local_600[0].bands[0][1].configurations.vec + lVar8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][1].configurations.vec + lVar8 + 8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][1].eliminations.vec + lVar8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][1].eliminations.vec + lVar8 + 8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][2].configurations.vec + lVar8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][2].configurations.vec + lVar8 + 8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][2].eliminations.vec + lVar8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][2].eliminations.vec + lVar8 + 8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][0].configurations.vec + lVar8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][0].configurations.vec + lVar8 + 8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][0].eliminations.vec + lVar8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][0].eliminations.vec + lVar8 + 8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][1].configurations.vec + lVar8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][1].configurations.vec + lVar8 + 8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][1].eliminations.vec + lVar8) = 0;
    *(undefined8 *)((long)local_600[0].bands[0][1].eliminations.vec + lVar8 + 8) = 0;
    do {
      puVar1 = (undefined8 *)((long)(pSVar6->bands + -1) + 0x50 + lVar10);
      *puVar1 = 0x1ff01ff01ff01ff;
      puVar1[1] = 0x1ff01ff;
      puVar1 = (undefined8 *)((long)pSVar6->bands[0][0].configurations.vec + lVar10);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar10 = lVar10 + 0x20;
    } while (lVar10 != 0x70);
    lVar8 = lVar8 + 0x60;
    pSVar6 = (State *)(pSVar6->bands + 1);
  } while (lVar8 != 0xc0);
  lVar8 = 0xc0;
  do {
    *(undefined8 *)((long)local_600[0].bands[0][0].configurations.vec + lVar8) = 0x1ff01ff01ff01ff;
    *(undefined8 *)((long)local_600[0].bands[0][0].configurations.vec + lVar8 + 8) =
         0x1ff01ff01ff01ff;
    *(undefined8 *)((long)local_600[0].bands[0][0].eliminations.vec + lVar8) = 0x1ff01ff01ff01ff;
    *(undefined8 *)((long)local_600[0].bands[0][0].eliminations.vec + lVar8 + 8) = 0x1ff01ff01ff01ff
    ;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0x1e0);
  if (pencilmark) {
    anon_unknown.dwarf_8b17::SolverDpllTriadSimd<0>::InitPencilmarkByBox(puzzle,local_600);
  }
  else {
    anon_unknown.dwarf_8b17::SolverDpllTriadSimd<0>::InitVanillaByBand(puzzle,local_600);
  }
  Util::Permutation(local_638,(Util *)((anonymous_namespace)::generator + 0x220),0x2d9);
  piVar11 = local_638[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    if (piVar11 ==
        local_638[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      if (local_638[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start != (int *)0x0) {
        operator_delete(local_638[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_638[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_638[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return false;
    }
    iVar2 = *piVar11;
    iVar3 = iVar2 / 9;
    if (pencilmark) {
      if (puzzle[iVar2] != '.') {
LAB_001055f4:
        iVar4 = iVar2 / 0x51;
        cVar7 = (char)iVar3 + (char)(iVar3 / 9) * -9;
        uVar9 = cVar7 * 0x56;
        cVar12 = (char)((uVar9 & 0xffff) >> 0xf) + (char)(uVar9 >> 8);
        uVar5 = (*(code *)(&DAT_0010ac48 +
                          *(int *)(&DAT_0010ac48 +
                                  (ulong)(uint)((int)(char)(cVar7 + cVar12 * -3) +
                                               iVar4 * 4 + (iVar4 / 3) * -0xc) * 4)))
                          ((ulong)((long)iVar4 * 0x55555556) >> 0x3f,
                           &DAT_0010ac48 +
                           *(int *)(&DAT_0010ac48 +
                                   (ulong)(uint)((int)(char)(cVar7 + cVar12 * -3) +
                                                iVar4 * 4 + (iVar4 / 3) * -0xc) * 4),
                           local_600[0].boxen + ((iVar2 / 0xf3) * 3 + (int)cVar12));
        return (bool)uVar5;
      }
    }
    else if (puzzle[iVar3] == '.') goto LAB_001055f4;
    piVar11 = (pointer)((long)piVar11 + 4);
  } while( true );
}

Assistant:

bool TdokuConstrain(bool pencilmark, char *puzzle) {
    return generator.Constrain(pencilmark, puzzle);
}